

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::AperB(double **_A,double **_B,double **_res,int _righA,int _colA,int _righB,
                     int _colB)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (0 < _righA) {
    uVar3 = 1;
    do {
      if (0 < _colB) {
        pdVar1 = _res[uVar3];
        uVar5 = 1;
        do {
          pdVar1[uVar5] = 0.0;
          if (0 < _colA) {
            pdVar2 = _A[uVar3];
            dVar6 = 0.0;
            uVar4 = 1;
            do {
              dVar6 = dVar6 + pdVar2[uVar4] * _B[uVar4][uVar5];
              pdVar1[uVar5] = dVar6;
              uVar4 = uVar4 + 1;
            } while (_colA + 1 != uVar4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != _colB + 1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != _righA + 1);
  }
  return;
}

Assistant:

void EDCircles::AperB(double ** _A, double ** _B, double ** _res, int _righA, int _colA, int _righB, int _colB)
{
	int p, q, l;
	for (p = 1; p <= _righA; p++)
		for (q = 1; q <= _colB; q++)
		{
			_res[p][q] = 0.0;
			for (l = 1; l <= _colA; l++)
				_res[p][q] = _res[p][q] + _A[p][l] * _B[l][q];
		}
}